

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmMakefile *this_00;
  cmGeneratedFileStream *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  ostream *poVar6;
  reference path;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  undefined1 useWatcomQuote_00;
  string local_1d0;
  string local_1b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  const_iterator i_1;
  undefined1 local_170 [8];
  string currentBinDir;
  string local_148;
  string local_128;
  string local_108;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  const_iterator i;
  string local_c8;
  char *local_a8;
  char *lineContinue;
  string object;
  allocator local_69;
  string local_68;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool useWatcomQuote_local;
  string *variableNameExternal_local;
  string *variableName_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar7 = this->LocalGenerator;
  local_21 = useWatcomQuote;
  psStack_20 = variableNameExternal;
  variableNameExternal_local = variableName;
  variableName_local = (string *)this;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_OBJECTS",&local_69);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_48,pcVar7,psVar3,&local_68);
  std::__cxx11::string::operator=((string *)variableNameExternal_local,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,"# Object files for target ");
  poVar6 = poVar4;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,(string *)variableNameExternal_local);
  std::operator<<(poVar4," =");
  std::__cxx11::string::string((string *)&lineContinue);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"CMAKE_MAKE_LINE_CONTINUE",(allocator *)((long)&i._M_current + 7));
  pcVar5 = cmMakefile::GetDefinition(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
  local_a8 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    local_a8 = "\\";
  }
  local_e0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Objects);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_d8,&local_e0);
  while( true ) {
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Objects);
    bVar2 = __gnu_cxx::operator!=(&local_d8,&local_e8);
    if (!bVar2) break;
    poVar4 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar4 = std::operator<<(poVar4,local_a8);
    std::operator<<(poVar4,"\n");
    pcVar1 = this->BuildFileStream;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_d8);
    pcVar7 = (cmLocalUnixMakefileGenerator3 *)std::__cxx11::string::c_str();
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
              (&local_108,pcVar7,(char *)(ulong)(local_21 & 1),SUB81(poVar6,0));
    std::operator<<((ostream *)pcVar1,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_d8);
  }
  std::operator<<((ostream *)this->BuildFileStream,"\n");
  pcVar7 = this->LocalGenerator;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"_EXTERNAL_OBJECTS",
             (allocator *)(currentBinDir.field_2._M_local_buf + 0xf));
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_128,pcVar7,psVar3,&local_148);
  std::__cxx11::string::operator=((string *)psStack_20,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(currentBinDir.field_2._M_local_buf + 0xf));
  poVar6 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  poVar6 = std::operator<<(poVar6,"# External object files for target ");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar6 = std::operator<<(poVar6,(string *)psVar3);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,(string *)psStack_20);
  std::operator<<(poVar6," =");
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_170,pcVar5,(allocator *)((long)&i_1._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
  local_188._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->ExternalObjects);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_180,&local_188);
  while( true ) {
    local_190._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->ExternalObjects);
    bVar2 = __gnu_cxx::operator!=(&local_180,&local_190);
    if (!bVar2) break;
    pcVar7 = this->LocalGenerator;
    path = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_180);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_1b0,pcVar7,(string *)local_170,path);
    useWatcomQuote_00 = SUB81(path,0);
    std::__cxx11::string::operator=((string *)&lineContinue,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    poVar6 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar6 = std::operator<<(poVar6,local_a8);
    std::operator<<(poVar6,"\n");
    pcVar1 = this->BuildFileStream;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_180);
    pcVar7 = (cmLocalUnixMakefileGenerator3 *)std::__cxx11::string::c_str();
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath_abi_cxx11_
              (&local_1d0,pcVar7,(char *)(ulong)(local_21 & 1),(bool)useWatcomQuote_00);
    std::operator<<((ostream *)pcVar1,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_180);
  }
  poVar6 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)&lineContinue);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::vector<std::string>::const_iterator i = this->Objects.begin();
       i != this->Objects.end(); ++i) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::vector<std::string>::const_iterator i =
         this->ExternalObjects.begin();
       i != this->ExternalObjects.end(); ++i) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, *i);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream << this->LocalGenerator->ConvertToQuotedOutputPath(
      i->c_str(), useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}